

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

uint gl4cts::ShaderSubroutine::Utils::getComponentSizeForVariableType(_variable_type *variable_type)

{
  _variable_type _Var1;
  TestError *this;
  uint local_18;
  uint result;
  _variable_type base_variable_type;
  _variable_type *variable_type_local;
  
  _Var1 = getBaseVariableType(variable_type);
  switch(_Var1) {
  case VARIABLE_TYPE_BOOL:
    local_18 = 1;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized base variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x439);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case VARIABLE_TYPE_DOUBLE:
    local_18 = 8;
    break;
  case VARIABLE_TYPE_FLOAT:
    local_18 = 4;
    break;
  case VARIABLE_TYPE_INT:
    local_18 = 4;
    break;
  case VARIABLE_TYPE_UINT:
    local_18 = 4;
  }
  return local_18;
}

Assistant:

unsigned int Utils::getComponentSizeForVariableType(const _variable_type& variable_type)
{
	_variable_type base_variable_type = getBaseVariableType(variable_type);
	unsigned int   result			  = 0;

	switch (base_variable_type)
	{
	case VARIABLE_TYPE_BOOL:
		result = sizeof(bool);
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = sizeof(double);
		break;
	case VARIABLE_TYPE_FLOAT:
		result = sizeof(float);
		break;
	case VARIABLE_TYPE_INT:
		result = sizeof(int);
		break;
	case VARIABLE_TYPE_UINT:
		result = sizeof(unsigned int);
		break;

	default:
	{
		TCU_FAIL("Unrecognized base variable type");
	}
	} /* switch (variable_type) */

	return result;
}